

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O0

double ON_SubDSectorType::SectorCoefficientFromTheta(double sector_theta)

{
  double dVar1;
  double w;
  double wrange [2];
  double abs_cos_theta;
  double cos_tol;
  double cos_theta;
  double sector_theta_local;
  
  if ((sector_theta <= 0.0) || (3.141592653589793 < sector_theta)) {
    ON_SubDIncrementErrorCount();
    sector_theta_local = -9993.0;
  }
  else {
    cos_tol = cos(sector_theta);
    dVar1 = ABS(cos_tol);
    if (1e-06 < dVar1) {
      if (1e-06 < ABS(dVar1 - 0.5)) {
        if (1.0 <= dVar1 + 1e-06) {
          cos_tol = (double)(~-(ulong)(cos_tol < 0.0) & 0x3ff0000000000000 |
                            -(ulong)(cos_tol < 0.0) & 0xbff0000000000000);
        }
      }
      else {
        cos_tol = (double)(~-(ulong)(cos_tol < 0.0) & 0x3fe0000000000000 |
                          -(ulong)(cos_tol < 0.0) & 0xbfe0000000000000);
      }
    }
    else {
      cos_tol = 0.0;
    }
    sector_theta_local = cos_tol / 3.0 + 0.5;
    if ((sector_theta_local <= 0.16666666666666666) || (0.8333333333333334 <= sector_theta_local)) {
      if (0.16666666666666666 < sector_theta_local) {
        if (sector_theta_local < 0.8333333333333334) {
          ON_SubDIncrementErrorCount();
          sector_theta_local = -9993.0;
        }
        else {
          sector_theta_local = 0.8333333333333334;
        }
      }
      else {
        sector_theta_local = 0.16666666666666666;
      }
    }
  }
  return sector_theta_local;
}

Assistant:

double ON_SubDSectorType::SectorCoefficientFromTheta(
  double sector_theta
  )
{
  if (!(sector_theta > 0.0 && sector_theta <= ON_PI))
    return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorSectorCoefficient);

  double cos_theta = cos(sector_theta);

  // If cos_theta is near 0, +1/2, -1/2, +1 or -1, then use those values
  // so the weights have the easily identified values associated with the
  // most common cases.
  const double cos_tol = 1e-6;
  const double abs_cos_theta = fabs(cos_theta);
  if (abs_cos_theta <= cos_tol)
    cos_theta = 0.0;
  else if (fabs(abs_cos_theta - 0.5) <= cos_tol)
    cos_theta = (cos_theta < 0.0) ? -0.5 : 0.5;
  else if (abs_cos_theta + cos_tol >= 1.0)
    cos_theta = (cos_theta < 0.0) ? -1.0 : 1.0;

  // Quadrangle case: w = 1/2 + 1/3*cos(theta);
  const double  wrange[2] = { 1.0 / 6.0, 5.0 / 6.0 };
  const double w = 0.5 + cos_theta / 3.0;
  if (w > wrange[0] && w < wrange[1])
    return w;
  if (w <= wrange[0])
    return wrange[0];
  if (w >= wrange[1])
    return wrange[1];

  return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::ErrorSectorCoefficient);
}